

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

LayoutBindingTestResult * __thiscall
glcts::AtomicCounterLayoutBindingCase::binding_array_size
          (LayoutBindingTestResult *__return_storage_ptr__,AtomicCounterLayoutBindingCase *this)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  reference piVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LayoutBindingProgram *pLVar6;
  reference pvVar7;
  mapped_type_conflict *pmVar8;
  bool bVar9;
  String local_688;
  int *local_668;
  allocator<char> local_659;
  String local_658;
  String local_638;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_618;
  undefined1 local_600 [8];
  StringIntMap bindingPoints;
  string local_5b0 [32];
  undefined1 local_590 [8];
  ostringstream texUnitStr;
  StringVector list;
  String local_3f8;
  LayoutBindingProgramAutoPtr local_3d8;
  LayoutBindingProgramAutoPtr program;
  String local_3b0;
  String local_390;
  string local_370 [32];
  String local_350;
  String local_330;
  allocator<char> local_309;
  string local_308 [32];
  string local_2e8 [32];
  String local_2c8;
  string local_2a8 [32];
  String local_288;
  allocator<char> local_261;
  String local_260;
  String local_240;
  allocator<char> local_219;
  String local_218;
  undefined1 local_1f8 [8];
  String decl;
  undefined1 local_1c8 [8];
  StringStream s;
  iterator iStack_48;
  int arraySize;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  iterator it;
  vector<int,_std::allocator<int>_> arraySizes;
  bool passed;
  AtomicCounterLayoutBindingCase *this_local;
  
  arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = true;
  iVar3 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x21])();
  LayoutBindingBaseCase::makeSparseRange
            ((vector<int,_std::allocator<int>_> *)&it,&this->super_LayoutBindingBaseCase,iVar3,1);
  local_40._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)&it);
  while( true ) {
    iStack_48 = std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)&it);
    bVar2 = __gnu_cxx::operator<(&local_40,&stack0xffffffffffffffb8);
    if (!bVar2) break;
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_40);
    s.super_ostringstream._372_4_ = *piVar4;
    StringStream::StringStream((StringStream *)local_1c8);
    poVar5 = std::operator<<((ostream *)local_1c8,"[");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,s.super_ostringstream._372_4_);
    std::operator<<(poVar5,"]");
    iVar3 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x13])();
    pcVar1 = *(char **)CONCAT44(extraout_var,iVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,pcVar1,&local_219);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1a])(&local_240,this,0);
    iVar3 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x13])();
    pcVar1 = *(char **)(CONCAT44(extraout_var_00,iVar3) + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,pcVar1,&local_261);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_2a8,this,0);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1c])(&local_288,this,local_2a8);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_2e8,this,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_308,"float",&local_309);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1d])(&local_2c8,this,local_2e8,local_308);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(&local_330,this,0);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1e])(&local_350,this,(ulong)(uint)s.super_ostringstream._372_4_);
    LayoutBindingBaseCase::buildUniformDecl
              ((String *)local_1f8,&this->super_LayoutBindingBaseCase,&local_218,&local_240,
               &local_260,&local_288,&local_2c8,&local_330,&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string(local_308);
    std::allocator<char>::~allocator(&local_309);
    std::__cxx11::string::~string(local_2e8);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_219);
    LayoutBindingBaseCase::setTemplateParam
              (&this->super_LayoutBindingBaseCase,"UNIFORM_DECL",(String *)local_1f8);
    StringStream::reset((StringStream *)local_1c8);
    std::operator<<((ostream *)local_1c8,"float accumulate(void)\n");
    std::operator<<((ostream *)local_1c8,"{\n");
    std::operator<<((ostream *)local_1c8,"  float acc = 0.0;\n");
    poVar5 = std::operator<<((ostream *)local_1c8,"  for(int i=0; i < ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,s.super_ostringstream._372_4_);
    std::operator<<(poVar5," ; i++)\n");
    poVar5 = std::operator<<((ostream *)local_1c8,"    acc = float(atomicCounter(");
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_370,this,0);
    poVar5 = std::operator<<(poVar5,local_370);
    std::operator<<(poVar5,"[i]));\n");
    std::__cxx11::string::~string(local_370);
    std::operator<<((ostream *)local_1c8,"  return acc;\n");
    std::operator<<((ostream *)local_1c8,"}\n");
    std::__cxx11::ostringstream::str();
    LayoutBindingBaseCase::setTemplateParam
              (&this->super_LayoutBindingBaseCase,"OPTIONAL_FUNCTION_BLOCK",&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    StringStream::reset((StringStream *)local_1c8);
    std::operator<<((ostream *)local_1c8,"vec4(accumulate(), 1.0, 0.0, 1.0);\n");
    std::__cxx11::ostringstream::str();
    LayoutBindingBaseCase::setTemplateParam
              (&this->super_LayoutBindingBaseCase,"UNIFORM_ACCESS",&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    LayoutBindingBaseCase::updateTemplate(&this->super_LayoutBindingBaseCase);
    std::__cxx11::string::string((string *)&program);
    LayoutBindingBaseCase::setTemplateParam
              (&this->super_LayoutBindingBaseCase,"OPTIONAL_FUNCTION_BLOCK",(String *)&program);
    std::__cxx11::string::~string((string *)&program);
    LayoutBindingProgram::LayoutBindingProgramAutoPtr::LayoutBindingProgramAutoPtr
              (&local_3d8,&(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier);
    pLVar6 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_3d8);
    bVar2 = LayoutBindingProgram::compiledAndLinked(pLVar6);
    bVar2 = (arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._7_1_ & bVar2) != 0;
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&texUnitStr.field_0x170);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(local_5b0,this,0);
      poVar5 = std::operator<<((ostream *)local_590,local_5b0);
      std::operator<<(poVar5,"[0]");
      std::__cxx11::string::~string(local_5b0);
      std::__cxx11::ostringstream::str();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&texUnitStr.field_0x170,
                  (value_type *)&bindingPoints._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string
                ((string *)&bindingPoints._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pLVar6 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_3d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_618,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&texUnitStr.field_0x170);
      (*pLVar6->_vptr_LayoutBindingProgram[3])(local_600,pLVar6,&local_618);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_618);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&texUnitStr.field_0x170,0);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_600,pvVar7);
      bVar9 = *pmVar8 == 0;
      arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._7_1_ = bVar2 && bVar9;
      if (!bVar2 || !bVar9) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_658,"binding point did not match default",&local_659);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&texUnitStr.field_0x170,0);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)local_600,pvVar7);
        LayoutBindingBaseCase::generateLog<int,int>
                  (&local_638,&this->super_LayoutBindingBaseCase,&local_658,*pmVar8,1);
        LayoutBindingTestResult::LayoutBindingTestResult
                  (__return_storage_ptr__,
                   arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._7_1_,&local_638,false);
        std::__cxx11::string::~string((string *)&local_638);
        std::__cxx11::string::~string((string *)&local_658);
        std::allocator<char>::~allocator(&local_659);
      }
      bVar9 = !bVar2 || !bVar9;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_600);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&texUnitStr.field_0x170);
    }
    else {
      pLVar6 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_3d8);
      LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_3f8,pLVar6,false);
      LayoutBindingTestResult::LayoutBindingTestResult
                (__return_storage_ptr__,bVar2,&local_3f8,false);
      std::__cxx11::string::~string((string *)&local_3f8);
      bVar9 = true;
      arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._7_1_ = bVar2;
    }
    LayoutBindingProgram::LayoutBindingProgramAutoPtr::~LayoutBindingProgramAutoPtr(&local_3d8);
    std::__cxx11::string::~string((string *)local_1f8);
    StringStream::~StringStream((StringStream *)local_1c8);
    if (bVar9) goto LAB_013aa7f6;
    local_668 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator++(&local_40,0);
  }
  std::__cxx11::string::string((string *)&local_688);
  LayoutBindingTestResult::LayoutBindingTestResult
            (__return_storage_ptr__,
             arraySizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._7_1_,&local_688,false);
  std::__cxx11::string::~string((string *)&local_688);
LAB_013aa7f6:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&it);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult binding_array_size(void)
	{
		bool passed = true;

		//== test different sized arrays
		std::vector<int> arraySizes = makeSparseRange(maxArraySize(), 1);
		for (std::vector<int>::iterator it = arraySizes.begin(); it < arraySizes.end(); it++)
		{
			int			 arraySize = *it;
			StringStream s;
			s << "[" << arraySize << "]";
			String decl =
				buildUniformDecl(String(getTestParameters().keyword), buildLayout(0),
								 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								 buildBlock(getDefaultUniformName()), getDefaultUniformName(), buildArray(arraySize));
			setTemplateParam("UNIFORM_DECL", decl);

			s.reset();
			// build a function that accesses the whole array
			s << "float accumulate(void)\n";
			s << "{\n";
			s << "  float acc = 0.0;\n";
			s << "  for(int i=0; i < " << arraySize << " ; i++)\n";
			s << "    acc = float(atomicCounter(" << getDefaultUniformName() << "[i]));\n";
			s << "  return acc;\n";
			s << "}\n";

			setTemplateParam("OPTIONAL_FUNCTION_BLOCK", s.str());

			s.reset();
			s << "vec4(accumulate(), 1.0, 0.0, 1.0);\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());
			updateTemplate();

			setTemplateParam("OPTIONAL_FUNCTION_BLOCK", String());

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}

			StringVector	   list;
			std::ostringstream texUnitStr;
			texUnitStr << getDefaultUniformName() << "[0]";
			list.push_back(texUnitStr.str());

			StringIntMap bindingPoints = program->getBindingPoints(list);
			passed &= (0 == bindingPoints[list[0]]);
			if (!passed)
			{
				return LayoutBindingTestResult(
					passed, generateLog(String("binding point did not match default"), bindingPoints[list[0]], 1));
			}
		}

		return LayoutBindingTestResult(passed, String());
	}